

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

double Fra_ImpComputeStateSpaceRatio(Fra_Man_t *p)

{
  int iVar1;
  int Left_00;
  Fra_Sml_t *p_00;
  uint *pResult_00;
  int local_48;
  int i;
  int Imp;
  int Right;
  int Left;
  double Ratio;
  uint *pResult;
  Fra_Sml_t *pComb;
  int nSimWords;
  Fra_Man_t *p_local;
  
  if ((p->pCla->vImps == (Vec_Int_t *)0x0) || (iVar1 = Vec_IntSize(p->pCla->vImps), iVar1 == 0)) {
    p_local = (Fra_Man_t *)0x0;
  }
  else {
    p_00 = Fra_SmlSimulateComb(p->pManAig,0x40,0);
    pResult_00 = Fra_ObjSim(p_00,0);
    if (*pResult_00 != 0) {
      __assert_fail("pResult[0] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraImp.c"
                    ,0x281,"double Fra_ImpComputeStateSpaceRatio(Fra_Man_t *)");
    }
    for (local_48 = 0; iVar1 = Vec_IntSize(p->pCla->vImps), local_48 < iVar1;
        local_48 = local_48 + 1) {
      iVar1 = Vec_IntEntry(p->pCla->vImps,local_48);
      Left_00 = Fra_ImpLeft(iVar1);
      iVar1 = Fra_ImpRight(iVar1);
      Sml_NodeSaveNotImpPatterns(p_00,Left_00,iVar1,pResult_00);
    }
    iVar1 = Fra_SmlCountOnesOne(p_00,0);
    p_local = (Fra_Man_t *)
              (((double)iVar1 * 100.0) / (double)((p_00->nWordsTotal - p_00->nWordsPref) * 0x20));
    Fra_SmlStop(p_00);
  }
  return (double)p_local;
}

Assistant:

double Fra_ImpComputeStateSpaceRatio( Fra_Man_t * p )
{
    int nSimWords = 64;
    Fra_Sml_t * pComb;
    unsigned * pResult;
    double Ratio = 0.0;
    int Left, Right, Imp, i;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return Ratio;
    // simulate the AIG manager with combinational patterns
    pComb = Fra_SmlSimulateComb( p->pManAig, nSimWords, 0 );
    // go through the implications and collect where they do not hold
    pResult = Fra_ObjSim( pComb, 0 );
    assert( pResult[0] == 0 );
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        Sml_NodeSaveNotImpPatterns( pComb, Left, Right, pResult );
    }
    // count the number of ones in this area
    Ratio = 100.0 * Fra_SmlCountOnesOne( pComb, 0 ) / (32*(pComb->nWordsTotal-pComb->nWordsPref));
    Fra_SmlStop( pComb );
    return Ratio;
}